

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_choice(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  lysp_node *plVar1;
  lyd_node *plVar2;
  int iVar3;
  LY_ERR LVar4;
  lysp_node *parent_00;
  lysp_node *plVar5;
  char *pcVar6;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar7;
  yang_arg arg;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar4 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar4 == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x68);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar4 = LY_EMEM;
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_choice");
    }
    else {
      plVar1 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar1;
          plVar1 = plVar5->next;
        } while (plVar1 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = parent_00;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar4 = lydict_insert(plVar7,stmt->arg,0,&parent_00->name);
      if (LVar4 == LY_SUCCESS) {
        parent_00->nodetype = 2;
        parent_00->parent = parent;
        stmt_01 = stmt->child;
        LVar4 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &parent_00->exts;
          plVar1 = parent_00 + 1;
          iVar3 = (int)parent_00;
          flags = &parent_00->flags;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x50000) {
              if ((int)stmt_00 < 0x400) {
                if ((int)stmt_00 < 0x100) {
                  if (stmt_00 == LY_STMT_ANYDATA) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                      format = 
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ;
                      pcVar6 = "anydata";
                      goto LAB_001691f8;
                    }
                  }
                  else if (stmt_00 != LY_STMT_ANYXML) goto LAB_00169174;
                  LVar4 = lysp_stmt_any(ctx,stmt_01,parent_00,&plVar1->parent);
                }
                else if (stmt_00 == LY_STMT_CASE) {
                  LVar4 = lysp_stmt_case(ctx,stmt_01,parent_00,&plVar1->parent);
                }
                else {
                  if (stmt_00 != LY_STMT_CHOICE) goto LAB_00169174;
                  plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  if (*(byte *)&plVar2[2].schema < 2) {
                    plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
                    pcVar6 = "choice";
                    goto LAB_001691f8;
                  }
                  LVar4 = lysp_stmt_choice(ctx,stmt_01,parent_00,&plVar1->parent);
                }
              }
              else if ((int)stmt_00 < 0x2000) {
                if (stmt_00 == LY_STMT_CONTAINER) {
                  LVar4 = lysp_stmt_container(ctx,stmt_01,parent_00,&plVar1->parent);
                }
                else {
                  if (stmt_00 != LY_STMT_LEAF) goto LAB_00169174;
                  LVar4 = lysp_stmt_leaf(ctx,stmt_01,parent_00,&plVar1->parent);
                }
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar4 = lysp_stmt_leaflist(ctx,stmt_01,parent_00,&plVar1->parent);
              }
              else {
                if (stmt_00 != LY_STMT_LIST) goto LAB_00169174;
                LVar4 = lysp_stmt_list(ctx,stmt_01,parent_00,&plVar1->parent);
              }
LAB_00169130:
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
            }
            else {
              arg = (yang_arg)exts;
              if (0x12ffff < (int)stmt_00) {
                if ((int)stmt_00 < 0x270000) {
                  if (stmt_00 == LY_STMT_IF_FEATURE) {
                    LVar4 = lysp_stmt_qnames(ctx,stmt_01,&parent_00->iffeatures,arg,in_R8);
                  }
                  else {
                    if (stmt_00 != LY_STMT_MANDATORY) goto LAB_00169174;
                    LVar4 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
                  }
                }
                else {
                  substmt_index = iVar3 + 0x28;
                  if (stmt_00 == LY_STMT_REFERENCE) goto LAB_001690f9;
                  if (stmt_00 == LY_STMT_STATUS) {
                    LVar4 = lysp_stmt_status(ctx,stmt_01,flags,exts);
                  }
                  else {
                    if (stmt_00 != LY_STMT_WHEN) goto LAB_00169174;
                    LVar4 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&parent_00[1].nodetype);
                  }
                }
                goto LAB_00169130;
              }
              if (0x7ffff < (int)stmt_00) {
                substmt_index = iVar3 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_001690f9:
                  in_R8 = exts;
                  LVar4 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,arg,in_R9);
                }
                else {
                  if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) goto LAB_00169174;
                  in_R8 = exts;
                  LVar4 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_CHOICE,0,exts);
                }
                goto LAB_00169130;
              }
              if (stmt_00 == LY_STMT_CONFIG) {
                LVar4 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                goto LAB_00169130;
              }
              if (stmt_00 != LY_STMT_DEFAULT) {
LAB_00169174:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar7 = (ly_ctx *)0x0;
                }
                else {
                  plVar7 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar6 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_001691f8:
                ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"choice");
                return LY_EVALID;
              }
              in_R8 = exts;
              LVar4 = lysp_stmt_text_field(ctx,stmt_01,iVar3 + 0x50,(char **)0x1,arg,in_R9);
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
              parent_00[1].name =
                   (char *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            stmt_01 = stmt_01->next;
            LVar4 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_choice(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_choice *choice;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new choice structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, choice, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &choice->name));
    choice->nodetype = LYS_CHOICE;
    choice->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->dsc, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &choice->iffeatures, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->ref, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &choice->when));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->dflt.str, Y_PREF_IDENTIF_ARG, &choice->exts));
            choice->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "choice");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(lysp_stmt_case(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CHOICE:
            PARSER_CHECK_STMTVER2_RET(ctx, "choice", "choice");
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_CHOICE, 0, &choice->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "choice");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}